

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O2

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  unique_ptr<qpdf::pl::String,_std::default_delete<qpdf::pl::String>_> local_30;
  _Alloc_hider local_28;
  __uniq_ptr_impl<qpdf::pl::String,_std::default_delete<qpdf::pl::String>_> local_20;
  
  local_20._M_t.super__Tuple_impl<0UL,_qpdf::pl::String_*,_std::default_delete<qpdf::pl::String>_>.
  super__Head_base<0UL,_qpdf::pl::String_*,_false>._M_head_impl =
       (tuple<qpdf::pl::String_*,_std::default_delete<qpdf::pl::String>_>)
       (_Tuple_impl<0UL,_qpdf::pl::String_*,_std::default_delete<qpdf::pl::String>_>)0x0;
  local_28._M_p = (pointer)0x0;
  std::make_unique<qpdf::pl::String,char_const(&)[1],decltype(nullptr),std::__cxx11::string&>
            ((char (*) [1])&local_30,(void **)0x229c56,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::
  make_unique<qpdf::pl::Link,decltype(nullptr),std::unique_ptr<qpdf::pl::String,std::default_delete<qpdf::pl::String>>>
            ((void **)args,
             (unique_ptr<qpdf::pl::String,_std::default_delete<qpdf::pl::String>_> *)&local_20);
  std::unique_ptr<qpdf::pl::String,_std::default_delete<qpdf::pl::String>_>::~unique_ptr(&local_30);
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)args;
}

Assistant:

std::unique_ptr<Link>
    create(Args&&... args)
    {
        return std::make_unique<Link>(
            nullptr, std::make_unique<P>("", nullptr, std::forward<Args>(args)...));
    }